

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu1_v2.c
# Opt level: O2

MPP_RET hal_vp8e_vepu1_gen_regs_v2(void *hal,HalEncTask *task)

{
  undefined1 uVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  void *__s;
  MPP_RET MVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  
  iVar5 = (task->rc_task->info).quality_target;
  iVar20 = 0x7f;
  if (iVar5 < 0x7f) {
    iVar20 = iVar5;
  }
  iVar5 = 0;
  if (0 < iVar20) {
    iVar5 = iVar20;
  }
  *(int *)(*(long *)((long)hal + 0x158) + 0x18) = iVar5;
  if (*(int *)((long)hal + 0x6910) == 0) {
    MVar6 = hal_vp8e_setup(hal);
    if (MVar6 != MPP_OK) {
      _mpp_log_l(2,"hal_vp8e_vepu1_v2","failed to init hal vp8e\n",(char *)0x0);
      return MVar6;
    }
    *(undefined4 *)((long)hal + 0x6910) = 1;
  }
  *(undefined8 *)((long)hal + 0x68f8) = 0;
  *(undefined8 *)((long)hal + 0x6900) = 0;
  *(undefined8 *)((long)hal + 0x68e8) = 0;
  *(undefined8 *)((long)hal + 0x68f0) = 0;
  *(undefined4 *)((long)hal + 0x6908) = 0;
  hal_vp8e_enc_strm_code(hal,task);
  __s = *(void **)((long)hal + 0x58);
  memset(__s,0,0x290);
  *(uint *)((long)__s + 4) = (uint)(*(int *)((long)hal + 0x160) != 0) * 2;
  if ((*(uint *)((long)hal + 0x18c) < 4) || (*(uint *)((long)hal + 0x18c) < 7)) {
    *(undefined4 *)((long)__s + 8) = 0xd00f;
  }
  else {
    *(undefined4 *)((long)__s + 8) = 0x900e;
  }
  *(undefined4 *)((long)__s + 0x14) = *(undefined4 *)((long)hal + 0x194);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),5,*(RK_U32 *)((long)hal + 0x198));
  iVar5 = *(int *)((long)hal + 0x1ac);
  *(int *)((long)__s + 0x18) = iVar5;
  uVar21 = (uint)(iVar5 != 0) << 0x1d;
  uVar7 = *(uint *)((long)__s + 0x38);
  *(uint *)((long)__s + 0x38) = uVar7 & 0xdfffffff | uVar21;
  *(uint *)((long)__s + 0x38) =
       uVar7 & 0x9fffffff | uVar21 | (uint)(*(int *)((long)hal + 0x374) != 0) << 0x1e;
  *(undefined4 *)((long)__s + 0x1c) = *(undefined4 *)((long)hal + 0x1c4);
  *(undefined4 *)((long)__s + 0x20) = *(undefined4 *)((long)hal + 0x1cc);
  *(undefined4 *)((long)__s + 0x24) = *(undefined4 *)((long)hal + 0x1bc);
  *(undefined4 *)((long)__s + 0x28) = *(undefined4 *)((long)hal + 0x1c0);
  *(undefined4 *)((long)__s + 0x2c) = *(undefined4 *)((long)hal + 0x1d4);
  if (*(RK_U32 *)((long)hal + 0x1d8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0xb,*(RK_U32 *)((long)hal + 0x1d8));
  }
  *(undefined4 *)((long)__s + 0x30) = *(undefined4 *)((long)hal + 0x1dc);
  if (*(RK_U32 *)((long)hal + 0x1e0) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0xc,*(RK_U32 *)((long)hal + 0x1e0));
  }
  *(undefined4 *)((long)__s + 0x34) = *(undefined4 *)((long)hal + 0x1e4);
  if (*(RK_U32 *)((long)hal + 0x1e8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0xd,*(RK_U32 *)((long)hal + 0x1e8));
  }
  uVar7 = *(uint *)((long)__s + 0x38);
  *(uint *)((long)__s + 0x38) = uVar7 | 0x80000000;
  uVar21 = (*(uint *)((long)hal + 0x1b0) & 1) << 0x1c;
  *(uint *)((long)__s + 0x38) = uVar7 & 0xefffffff | 0x80000000 | uVar21;
  uVar22 = (*(uint *)((long)hal + 0x1b4) & 1) << 6;
  *(uint *)((long)__s + 0x38) = uVar7 & 0xefffffbf | 0x80000000 | uVar21 | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x168) & 0x1ff) << 0x13;
  *(uint *)((long)__s + 0x38) = uVar7 & 0xe007ffbf | 0x80000000 | uVar21 | uVar22 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x164) & 0x1ff) << 10;
  *(uint *)((long)__s + 0x38) = uVar7 & 0xe00003bf | 0x80000000 | uVar21 | uVar22 | uVar23 | uVar24;
  uVar7 = (uVar7 & 0xe00003a7 | 0x80000000 | uVar21 | uVar22 | uVar23 | uVar24) +
          (*(uint *)((long)hal + 0x170) & 3) * 8;
  *(uint *)((long)__s + 0x38) = uVar7;
  *(uint *)((long)__s + 0x38) = (uVar7 & 0xfffffff9) + (*(uint *)((long)hal + 0x174) & 3) * 2;
  uVar21 = *(int *)((long)hal + 0x2fc) << 0x1d;
  uVar7 = *(uint *)((long)__s + 0x3c);
  *(uint *)((long)__s + 0x3c) = uVar7 & 0x1fffffff | uVar21;
  uVar22 = (*(uint *)((long)hal + 0x2f8) & 7) << 0x1a;
  *(uint *)((long)__s + 0x3c) = uVar7 & 0x3ffffff | uVar21 | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x178) & 0x3fff) << 0xc;
  *(uint *)((long)__s + 0x3c) = uVar7 & 0xfff | uVar21 | uVar22 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x17c) & 3) << 10;
  *(uint *)((long)__s + 0x3c) = uVar7 & 0x3ff | uVar21 | uVar22 | uVar23 | uVar24;
  uVar25 = (*(uint *)((long)hal + 0x180) & 0xf) << 6;
  *(uint *)((long)__s + 0x3c) = uVar7 & 0x3f | uVar21 | uVar22 | uVar23 | uVar24 | uVar25;
  uVar7 = (uVar7 & 3 | uVar21 | uVar22 | uVar23 | uVar24 | uVar25) +
          (*(uint *)((long)hal + 0x18c) & 0xf) * 4;
  *(uint *)((long)__s + 0x3c) = uVar7;
  *(uint *)((long)__s + 0x3c) = uVar7 & 0xfffffffc | *(uint *)((long)hal + 400) & 3;
  uVar7 = *(uint *)((long)__s + 0x48) & 0xfffbffff | (*(uint *)((long)hal + 0x188) & 1) << 0x12;
  *(uint *)((long)__s + 0x48) = uVar7;
  uVar7 = CONCAT22((short)(uVar7 >> 0x10),*(undefined2 *)((long)hal + 0x310));
  *(uint *)((long)__s + 0x48) = uVar7;
  uVar21 = CONCAT22(*(undefined2 *)((long)__s + 0x56),*(undefined2 *)((long)hal + 0x318));
  *(uint *)((long)__s + 0x54) = uVar21;
  uVar22 = (*(uint *)((long)hal + 0x300) & 1) << 0x16;
  *(uint *)((long)__s + 0x48) = uVar7 & 0xffbfffff | uVar22;
  *(uint *)((long)__s + 0x48) = uVar7 & 0x3fbfffff | uVar22 | *(int *)((long)hal + 0x184) << 0x1e;
  *(uint *)((long)__s + 0x54) = uVar21 & 0xffffff | *(int *)((long)hal + 0x31c) << 0x18;
  uVar8 = (*(uint *)((long)hal + 0x4f0) & 1) << 0x1e;
  uVar7 = *(uint *)((long)__s + 0x4c);
  *(uint *)((long)__s + 0x4c) = uVar7 & 0xbfffffff | uVar8;
  uVar22 = (*(uint *)((long)hal + 0x4f4) & 0x3ff) << 0x14;
  uVar21 = *(uint *)((long)__s + 0x50);
  *(uint *)((long)__s + 0x50) = uVar21 & 0xc00fffff | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x4f8) & 0x3ff) << 10;
  *(uint *)((long)__s + 0x50) = uVar21 & 0xc00003ff | uVar22 | uVar23;
  *(uint *)((long)__s + 0x50) =
       uVar21 & 0xc0000000 | uVar22 | uVar23 | *(uint *)((long)hal + 0x4fc) & 0x3ff;
  uVar22 = (*(uint *)((long)hal + 0x500) & 0x1ff) << 0x13;
  uVar21 = *(uint *)((long)__s + 0xf8);
  *(uint *)((long)__s + 0xf8) = uVar21 & 0xf007ffff | uVar22;
  *(uint *)((long)__s + 0xf8) = uVar21 & 0x7ffff | uVar22 | *(int *)((long)hal + 0x4ec) << 0x1c;
  *(undefined4 *)((long)__s + 0x58) = *(undefined4 *)((long)hal + 0x1a4);
  *(undefined4 *)((long)__s + 0x5c) = *(undefined4 *)((long)hal + 0x1a8);
  *(undefined4 *)((long)__s + 0x60) = *(undefined4 *)((long)hal + 0x19c);
  *(undefined4 *)((long)__s + 0x40) = *(undefined4 *)((long)hal + 0x1c8);
  *(undefined4 *)((long)__s + 0x44) = *(undefined4 *)((long)hal + 0x1d0);
  uVar9 = *(ushort *)((long)hal + 0x3d4) & 0x3fff;
  uVar21 = *(uint *)((long)__s + 0x6c);
  *(uint *)((long)__s + 0x6c) = uVar21 & 0xffffc000 | uVar9;
  uVar10 = *(ushort *)((long)hal + 0x3dc) & 0x3fff;
  uVar22 = *(uint *)((long)__s + 0x70);
  *(uint *)((long)__s + 0x70) = uVar22 & 0xffffc000 | uVar10;
  uVar11 = *(ushort *)((long)hal + 0x3e4) & 0x3fff;
  uVar23 = *(uint *)((long)__s + 0x74);
  *(uint *)((long)__s + 0x74) = uVar23 & 0xffffc000 | uVar11;
  uVar12 = *(ushort *)((long)hal + 0x3ec) & 0x3fff;
  uVar24 = *(uint *)((long)__s + 0x78);
  *(uint *)((long)__s + 0x78) = uVar24 & 0xffffc000 | uVar12;
  uVar28 = *(ushort *)((long)hal + 0x3f4) & 0x3fff;
  uVar25 = *(uint *)((long)__s + 0x7c);
  *(uint *)((long)__s + 0x7c) = uVar25 & 0xffffc000 | uVar28;
  uVar29 = *(ushort *)((long)hal + 0x3fc) & 0x3fff;
  uVar27 = *(uint *)((long)__s + 0x80);
  *(uint *)((long)__s + 0x80) = uVar27 & 0xffffc000 | uVar29;
  uVar13 = (*(ushort *)((long)hal + 0x404) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x6c) = uVar21 & 0xff800000 | uVar9 | uVar13;
  uVar14 = (*(ushort *)((long)hal + 0x40c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x70) = uVar22 & 0xff800000 | uVar10 | uVar14;
  uVar15 = (*(ushort *)((long)hal + 0x414) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x74) = uVar23 & 0xff800000 | uVar11 | uVar15;
  uVar16 = (*(ushort *)((long)hal + 0x41c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x78) = uVar24 & 0xff800000 | uVar12 | uVar16;
  uVar17 = (*(ushort *)((long)hal + 0x424) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x7c) = uVar25 & 0xff800000 | uVar28 | uVar17;
  uVar18 = (*(ushort *)((long)hal + 0x42c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x80) = uVar27 & 0xff800000 | uVar29 | uVar18;
  *(uint *)((long)__s + 0x6c) =
       uVar21 & 0x80000000 | uVar9 | uVar13 | (uint)*(byte *)((long)hal + 0x434) << 0x17;
  *(uint *)((long)__s + 0x70) =
       uVar22 & 0x80000000 | uVar10 | uVar14 | (uint)*(byte *)((long)hal + 0x438) << 0x17;
  *(uint *)((long)__s + 0x74) =
       uVar23 & 0x80000000 | uVar11 | uVar15 | (uint)*(byte *)((long)hal + 0x43c) << 0x17;
  *(uint *)((long)__s + 0x78) =
       uVar24 & 0x80000000 | uVar12 | uVar16 | (uint)*(byte *)((long)hal + 0x440) << 0x17;
  *(uint *)((long)__s + 0x7c) =
       uVar25 & 0x80000000 | uVar28 | uVar17 | (uint)*(byte *)((long)hal + 0x444) << 0x17;
  *(uint *)((long)__s + 0x80) =
       uVar27 & 0x80000000 | uVar29 | uVar18 | (uint)*(byte *)((long)hal + 0x448) << 0x17;
  uVar22 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + 0x84) >> 8),
                    *(undefined1 *)((long)hal + 0x44c));
  *(uint *)((long)__s + 0x84) = uVar22;
  uVar23 = (*(ushort *)((long)hal + 0x454) & 0x1ff) << 8;
  *(uint *)((long)__s + 0x84) = uVar22 & 0xfffe00ff | uVar23;
  uVar24 = (*(ushort *)((long)hal + 0x45c) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x84) = uVar22 & 0xfc0000ff | uVar23 | uVar24;
  uVar25 = *(ushort *)((long)hal + 0x464) & 0x1ff;
  uVar21 = *(uint *)((long)__s + 0x88);
  *(uint *)((long)__s + 0x88) = uVar21 & 0xfffffe00 | uVar25;
  uVar27 = (uint)*(byte *)((long)hal + 0x46c) << 9;
  *(uint *)((long)__s + 0x88) = uVar21 & 0xfffe0000 | uVar25 | uVar27;
  uVar9 = (*(ushort *)((long)hal + 0x474) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x88) = uVar21 & 0xfc000000 | uVar25 | uVar27 | uVar9;
  *(uint *)((long)__s + 0x84) =
       uVar22 & 0xf00000ff | uVar23 | uVar24 | (*(uint *)((long)hal + 0x484) & 3) << 0x1a;
  uVar22 = (*(uint *)((long)hal + 0x488) & 3) << 0x1a;
  *(uint *)((long)__s + 0x88) = uVar21 & 0xf0000000 | uVar25 | uVar27 | uVar9 | uVar22;
  *(uint *)((long)__s + 0x88) =
       uVar21 & 0xe0000000 | uVar25 | uVar27 | uVar9 | uVar22 |
       (*(uint *)((long)hal + 0x48c) & 1) << 0x1c;
  *(undefined4 *)((long)__s + 0x8c) = *(undefined4 *)((long)hal + 0x490);
  uVar21 = *(uint *)((long)__s + 0x90) & 0xffffe0ff | (*(uint *)((long)hal + 0x494) & 0x1f) << 8;
  *(uint *)((long)__s + 0x90) = uVar21;
  uVar21 = CONCAT31((int3)(uVar21 >> 8),*(undefined1 *)((long)hal + 0x498));
  *(uint *)((long)__s + 0x90) = uVar21;
  uVar22 = (*(uint *)((long)hal + 0x4a0) & 0x3f) << 0xf;
  *(uint *)((long)__s + 0x90) = uVar21 & 0xffe07fff | uVar22;
  uVar23 = *(int *)((long)hal + 800) << 0x18;
  *(uint *)((long)__s + 0x90) = uVar21 & 0xe07fff | uVar22 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x4b0) & 7) << 0x15;
  *(uint *)((long)__s + 0x90) = uVar21 & 0x7fff | uVar22 | uVar23 | uVar24;
  *(uint *)((long)__s + 0x90) =
       uVar21 & 0x1fff | uVar22 | uVar23 | uVar24 | (*(uint *)((long)hal + 0x49c) & 3) << 0xd;
  *(uint *)((long)__s + 0x94) =
       *(uint *)((long)__s + 0x94) & 0xe07fffff | (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x17;
  *(undefined4 *)((long)__s + 0x9c) = *(undefined4 *)((long)hal + 0x304);
  *(uint *)((long)__s + 0xa0) =
       *(uint *)((long)__s + 0xa0) & 0x3fffffff | *(int *)((long)hal + 0x308) << 0x1e;
  uVar21 = (*(uint *)((long)hal + 0x324) & 0x3ff) << 10;
  *(uint *)((long)__s + 0x4c) = uVar7 & 0xbff003ff | uVar8 | uVar21;
  uVar22 = *(uint *)((long)hal + 0x328) & 0x3ff;
  *(uint *)((long)__s + 0x4c) = uVar7 & 0xbff00000 | uVar8 | uVar21 | uVar22;
  *(uint *)((long)__s + 0x4c) =
       uVar7 & 0x80000000 | uVar8 | uVar21 | uVar22 | (*(uint *)((long)hal + 0x32c) & 0x3ff) << 0x14
  ;
  *(undefined4 *)((long)__s + 0xcc) = *(undefined4 *)((long)hal + 0x378);
  *(undefined4 *)((long)__s + 0xd0) = *(undefined4 *)((long)hal + 0x374);
  uVar4 = *(undefined2 *)((long)hal + 900);
  *(undefined2 *)((long)__s + 0xd4) = uVar4;
  *(uint *)((long)__s + 0xd4) = CONCAT22(*(undefined2 *)((long)hal + 0x386),uVar4);
  uVar4 = *(undefined2 *)((long)hal + 0x388);
  *(undefined2 *)((long)__s + 0xd8) = uVar4;
  *(uint *)((long)__s + 0xd8) = CONCAT22(*(undefined2 *)((long)hal + 0x38a),uVar4);
  uVar7 = CONCAT22(*(undefined2 *)((long)__s + 0xde),*(undefined2 *)((long)hal + 0x38c));
  *(uint *)((long)__s + 0xdc) = uVar7;
  uVar21 = (*(byte *)((long)hal + 0x38e) & 0x1f) << 0x10;
  *(uint *)((long)__s + 0xdc) = uVar7 & 0xffe0ffff | uVar21;
  uVar22 = (*(byte *)((long)hal + 0x38f) & 0x1f) << 0x15;
  *(uint *)((long)__s + 0xdc) = uVar7 & 0xfc00ffff | uVar21 | uVar22;
  *(uint *)((long)__s + 0xdc) =
       uVar7 & 0x8000ffff | uVar21 | uVar22 | (*(byte *)((long)hal + 0x390) & 0x1f) << 0x1a;
  iVar5 = *(int *)((long)hal + 0x334);
  *(short *)((long)__s + 0xe6) = (short)iVar5;
  *(uint *)((long)__s + 0xe4) = (uint)*(ushort *)((long)hal + 0x338) | iVar5 << 0x10;
  uVar21 = *(int *)((long)hal + 0x340) << 0x18;
  uVar7 = *(uint *)((long)__s + 0xe0);
  *(uint *)((long)__s + 0xe0) = uVar7 & 0xffffff | uVar21;
  uVar22 = (*(uint *)((long)hal + 0x348) & 0xff) << 0x10;
  *(uint *)((long)__s + 0xe0) = uVar7 & 0xffff | uVar21 | uVar22;
  uVar7 = uVar7 & 0xff | uVar21 | uVar22 | (*(uint *)((long)hal + 0x33c) & 0xff) << 8;
  *(uint *)((long)__s + 0xe0) = uVar7;
  *(uint *)((long)__s + 0xe0) = CONCAT31((int3)(uVar7 >> 8),*(undefined1 *)((long)hal + 0x344));
  uVar21 = *(int *)((long)hal + 0x350) << 0x18;
  uVar7 = *(uint *)((long)__s + 0xf0);
  *(uint *)((long)__s + 0xf0) = uVar7 & 0xffffff | uVar21;
  uVar22 = (*(uint *)((long)hal + 0x358) & 0xff) << 0x10;
  *(uint *)((long)__s + 0xf0) = uVar7 & 0xffff | uVar21 | uVar22;
  uVar7 = uVar7 & 0xff | uVar21 | uVar22 | (*(uint *)((long)hal + 0x34c) & 0xff) << 8;
  *(uint *)((long)__s + 0xf0) = uVar7;
  *(uint *)((long)__s + 0xf0) = CONCAT31((int3)(uVar7 >> 8),*(undefined1 *)((long)hal + 0x354));
  uVar22 = *(int *)((long)hal + 0x360) << 0x18;
  uVar7 = *(uint *)((long)__s + 0xf4);
  *(uint *)((long)__s + 0xf4) = uVar7 & 0xffffff | uVar22;
  uVar21 = (*(uint *)((long)hal + 0x368) & 0xff) << 0x10;
  *(uint *)((long)__s + 0xf4) = uVar7 & 0xffff | uVar22 | uVar21;
  uVar7 = uVar7 & 0xff | uVar22 | uVar21 | (*(uint *)((long)hal + 0x35c) & 0xff) << 8;
  *(uint *)((long)__s + 0xf4) = uVar7;
  *(uint *)((long)__s + 0xf4) = CONCAT31((int3)(uVar7 >> 8),*(undefined1 *)((long)hal + 0x364));
  *(undefined4 *)((long)__s + 0xe8) = *(undefined4 *)((long)hal + 0x394);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x3a,*(RK_U32 *)((long)hal + 0x3b4));
  *(undefined4 *)((long)__s + 0xec) = *(undefined4 *)((long)hal + 0x398);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x3b,*(RK_U32 *)((long)hal + 0x3b8));
  *(undefined4 *)((long)__s + 0x68) = *(undefined4 *)((long)hal + 0x37c);
  uVar21 = *(uint *)((long)hal + 0x4b4) & 0xfff;
  uVar7 = *(uint *)((long)__s + 0x100);
  *(uint *)((long)__s + 0x100) = uVar7 & 0xfffff000 | uVar21;
  *(uint *)((long)__s + 0x100) =
       uVar7 & 0xff000000 | uVar21 | (*(uint *)((long)hal + 0x4b8) & 0xfff) << 0xc;
  uVar21 = *(uint *)((long)hal + 0x4bc) & 0xfff;
  uVar7 = *(uint *)((long)__s + 0x104);
  *(uint *)((long)__s + 0x104) = uVar7 & 0xfffff000 | uVar21;
  *(uint *)((long)__s + 0x104) =
       uVar7 & 0xff000000 | uVar21 | (*(uint *)((long)hal + 0x4c0) & 0xfff) << 0xc;
  for (lVar26 = 0; lVar26 != 5; lVar26 = lVar26 + 1) {
    uVar21 = *(uint *)((long)hal + lVar26 * 8 + 0x4c4) & 0xfff;
    uVar7 = *(uint *)((long)__s + lVar26 * 4 + 0x108);
    *(uint *)((long)__s + lVar26 * 4 + 0x108) = uVar7 & 0xfffff000 | uVar21;
    *(uint *)((long)__s + lVar26 * 4 + 0x108) =
         uVar7 & 0xff000000 | uVar21 | (*(uint *)((long)hal + lVar26 * 8 + 0x4c8) & 0xfff) << 0xc;
  }
  uVar7 = *(uint *)((long)__s + 0x88);
  uVar21 = (*(uint *)((long)hal + 0x47c) & 1) << 0x1d;
  *(uint *)((long)__s + 0x88) = uVar7 & 0xdfffffff | uVar21;
  *(uint *)((long)__s + 0x88) =
       uVar7 & 0x9fffffff | uVar21 | (*(uint *)((long)hal + 0x480) & 1) << 0x1e;
  *(undefined4 *)((long)__s + 0x11c) = *(undefined4 *)((long)hal + 0x380);
  puVar19 = (uint *)((long)__s + 0x13c);
  for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
    uVar21 = *(ushort *)((long)hal + lVar26 * 2 + 0x3d6) & 0x3fff;
    uVar7 = puVar19[-7];
    puVar19[-7] = uVar7 & 0xffffc000 | uVar21;
    uVar22 = (*(ushort *)((long)hal + lVar26 * 2 + 0x406) & 0x1ff) << 0xe;
    puVar19[-7] = uVar7 & 0xff800000 | uVar21 | uVar22;
    puVar19[-7] = uVar7 & 0x80000000 | uVar21 | uVar22 |
                  (uint)*(byte *)((long)hal + lVar26 + 0x435) << 0x17;
    uVar21 = *(ushort *)((long)hal + lVar26 * 2 + 0x3de) & 0x3fff;
    uVar7 = puVar19[-6];
    puVar19[-6] = uVar7 & 0xffffc000 | uVar21;
    uVar22 = (*(ushort *)((long)hal + lVar26 * 2 + 0x40e) & 0x1ff) << 0xe;
    puVar19[-6] = uVar7 & 0xff800000 | uVar21 | uVar22;
    puVar19[-6] = uVar7 & 0x80000000 | uVar21 | uVar22 |
                  (uint)*(byte *)((long)hal + lVar26 + 0x439) << 0x17;
    uVar21 = *(ushort *)((long)hal + lVar26 * 2 + 0x3e6) & 0x3fff;
    uVar7 = puVar19[-5];
    puVar19[-5] = uVar7 & 0xffffc000 | uVar21;
    uVar22 = (*(ushort *)((long)hal + lVar26 * 2 + 0x416) & 0x1ff) << 0xe;
    puVar19[-5] = uVar7 & 0xff800000 | uVar21 | uVar22;
    puVar19[-5] = uVar7 & 0x80000000 | uVar21 | uVar22 |
                  (uint)*(byte *)((long)hal + lVar26 + 0x43d) << 0x17;
    uVar21 = *(ushort *)((long)hal + lVar26 * 2 + 0x3ee) & 0x3fff;
    uVar7 = puVar19[-4];
    puVar19[-4] = uVar7 & 0xffffc000 | uVar21;
    uVar22 = (*(ushort *)((long)hal + lVar26 * 2 + 0x41e) & 0x1ff) << 0xe;
    puVar19[-4] = uVar7 & 0xff800000 | uVar21 | uVar22;
    puVar19[-4] = uVar7 & 0x80000000 | uVar21 | uVar22 |
                  (uint)*(byte *)((long)hal + lVar26 + 0x441) << 0x17;
    uVar21 = *(ushort *)((long)hal + lVar26 * 2 + 0x3f6) & 0x3fff;
    uVar7 = puVar19[-3];
    puVar19[-3] = uVar7 & 0xffffc000 | uVar21;
    uVar22 = (*(ushort *)((long)hal + lVar26 * 2 + 0x426) & 0x1ff) << 0xe;
    puVar19[-3] = uVar7 & 0xff800000 | uVar21 | uVar22;
    puVar19[-3] = uVar7 & 0x80000000 | uVar21 | uVar22 |
                  (uint)*(byte *)((long)hal + lVar26 + 0x445) << 0x17;
    uVar21 = *(ushort *)((long)hal + lVar26 * 2 + 0x3fe) & 0x3fff;
    uVar7 = puVar19[-2];
    puVar19[-2] = uVar7 & 0xffffc000 | uVar21;
    uVar22 = (*(ushort *)((long)hal + lVar26 * 2 + 0x42e) & 0x1ff) << 0xe;
    puVar19[-2] = uVar7 & 0xff800000 | uVar21 | uVar22;
    puVar19[-2] = uVar7 & 0x80000000 | uVar21 | uVar22 |
                  (uint)*(byte *)((long)hal + lVar26 + 0x449) << 0x17;
    uVar7 = CONCAT31((int3)(puVar19[-1] >> 8),*(undefined1 *)((long)hal + lVar26 * 2 + 0x44e));
    puVar19[-1] = uVar7;
    uVar21 = (*(ushort *)((long)hal + lVar26 * 2 + 0x456) & 0x1ff) << 8;
    puVar19[-1] = uVar7 & 0xfffe00ff | uVar21;
    puVar19[-1] = uVar7 & 0xfc0000ff | uVar21 |
                  (*(ushort *)((long)hal + lVar26 * 2 + 0x45e) & 0x1ff) << 0x11;
    uVar21 = *(ushort *)((long)hal + lVar26 * 2 + 0x466) & 0x1ff;
    uVar7 = *puVar19;
    *puVar19 = uVar7 & 0xfffffe00 | uVar21;
    uVar22 = (uint)*(byte *)((long)hal + lVar26 * 2 + 0x46e) << 9;
    *puVar19 = uVar7 & 0xfffe0000 | uVar21 | uVar22;
    uVar23 = (*(ushort *)((long)hal + lVar26 * 2 + 0x476) & 0x1ff) << 0x11;
    *puVar19 = uVar7 & 0xfc000000 | uVar21 | uVar22 | uVar23;
    *puVar19 = uVar21 | uVar22 | uVar23 | *(int *)((long)hal + lVar26 * 4 + 0x4a4) << 0x1a;
    puVar19 = puVar19 + 8;
  }
  uVar22 = *(uint *)((long)hal + 0x504) & 0x7f;
  uVar7 = *(uint *)((long)__s + 0x288);
  uVar21 = *(uint *)((long)__s + 0x28c);
  *(uint *)((long)__s + 0x288) = uVar7 & 0xffffff80 | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x508) & 0x7f) << 7;
  *(uint *)((long)__s + 0x288) = uVar7 & 0xffffc000 | uVar22 | uVar23;
  uVar24 = (*(uint *)((long)hal + 0x50c) & 0x7f) << 0xe;
  *(uint *)((long)__s + 0x288) = uVar7 & 0xffe00000 | uVar22 | uVar23 | uVar24;
  *(uint *)((long)__s + 0x288) =
       uVar7 & 0xf0000000 | uVar22 | uVar23 | uVar24 | (*(uint *)((long)hal + 0x510) & 0x7f) << 0x15
  ;
  uVar22 = *(uint *)((long)hal + 0x514) & 0x7f;
  *(uint *)((long)__s + 0x28c) = uVar21 & 0xffffff80 | uVar22;
  uVar23 = (*(uint *)((long)hal + 0x518) & 0x7f) << 7;
  *(uint *)((long)__s + 0x28c) = uVar21 & 0xffffc000 | uVar22 | uVar23;
  uVar7 = (*(uint *)((long)hal + 0x51c) & 0x7f) << 0xe;
  *(uint *)((long)__s + 0x28c) = uVar21 & 0xffe00000 | uVar22 | uVar23 | uVar7;
  *(uint *)((long)__s + 0x28c) =
       uVar21 & 0xf0000000 | uVar22 | uVar23 | uVar7 | (*(uint *)((long)hal + 0x520) & 0x7f) << 0x15
  ;
  for (lVar26 = -0x20; lVar26 != 0; lVar26 = lVar26 + 1) {
    uVar1 = *(undefined1 *)((long)hal + lVar26 * 4 + 0x27b);
    uVar7 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + lVar26 * 4 + 0x200) >> 8),uVar1);
    *(uint *)((long)__s + lVar26 * 4 + 0x200) = uVar7;
    bVar2 = *(byte *)((long)hal + lVar26 * 4 + 0x27a);
    uVar21 = (uint)bVar2 << 8;
    *(uint *)((long)__s + lVar26 * 4 + 0x200) = uVar7 & 0xffff00ff | uVar21;
    bVar3 = *(byte *)((long)hal + lVar26 * 4 + 0x279);
    *(uint *)((long)__s + lVar26 * 4 + 0x200) = uVar7 & 0xff0000ff | uVar21 | (uint)bVar3 << 0x10;
    *(uint *)((long)__s + lVar26 * 4 + 0x200) =
         CONCAT13(*(undefined1 *)((long)hal + lVar26 * 4 + 0x278),
                  CONCAT12(bVar3,CONCAT11(bVar2,uVar1)));
    uVar1 = *(undefined1 *)((long)hal + lVar26 * 4 + 0x2fb);
    uVar7 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + lVar26 * 4 + 0x280) >> 8),uVar1);
    *(uint *)((long)__s + lVar26 * 4 + 0x280) = uVar7;
    bVar2 = *(byte *)((long)hal + lVar26 * 4 + 0x2fa);
    uVar21 = (uint)bVar2 << 8;
    *(uint *)((long)__s + lVar26 * 4 + 0x280) = uVar7 & 0xffff00ff | uVar21;
    bVar3 = *(byte *)((long)hal + lVar26 * 4 + 0x2f9);
    *(uint *)((long)__s + lVar26 * 4 + 0x280) = uVar7 & 0xff0000ff | uVar21 | (uint)bVar3 << 0x10;
    *(uint *)((long)__s + lVar26 * 4 + 0x280) =
         CONCAT13(*(undefined1 *)((long)hal + lVar26 * 4 + 0x2f8),
                  CONCAT12(bVar3,CONCAT11(bVar2,uVar1)));
  }
  *(byte *)((long)__s + 0x38) = *(byte *)((long)__s + 0x38) | 1;
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp8e_vepu1_gen_regs_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    ctx->rc->qp_hdr = MPP_CLIP3(0, 127, task->rc_task->info.quality_target);

    if (!ctx->buffer_ready) {
        ret = hal_vp8e_setup(hal);
        if (ret) {
            mpp_err("failed to init hal vp8e\n");
            return ret;
        } else {
            ctx->buffer_ready = 1;
        }
    }

    memset(ctx->stream_size, 0, sizeof(ctx->stream_size));

    hal_vp8e_enc_strm_code(ctx, task);
    vp8e_vpu_frame_start(ctx);

    return MPP_OK;
}